

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::_load_dlm(CImg<unsigned_char> *this,FILE *file,char *filename)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  CImgArgumentException *this_00;
  char *pcVar6;
  char *pcVar7;
  uchar *puVar8;
  uint *puVar9;
  CImgIOException *this_01;
  char *local_128;
  FILE *local_e0;
  char local_9a [2];
  char c;
  double dStack_98;
  double val;
  int err;
  uint dy;
  uint dx;
  uint cdx;
  CImg<char> tmp;
  CImg<char> delimiter;
  FILE *nfile;
  char *filename_local;
  FILE *file_local;
  CImg<unsigned_char> *this_local;
  
  if ((file == (FILE *)0x0) && (filename == (char *)0x0)) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    uVar1 = this->_width;
    uVar2 = this->_height;
    uVar3 = this->_depth;
    uVar4 = this->_spectrum;
    puVar8 = this->_data;
    pcVar6 = "non-";
    if ((this->_is_shared & 1U) != 0) {
      pcVar6 = "";
    }
    pcVar7 = pixel_type();
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_dlm(): Specified filename is (null)."
               ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar8,pcVar6,pcVar7);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,
                CImgArgumentException::~CImgArgumentException);
  }
  local_e0 = (FILE *)file;
  if (file == (FILE *)0x0) {
    local_e0 = cimg::fopen(filename,"r");
  }
  CImg<char>::CImg((CImg<char> *)&tmp._data,0x100,1,1,1);
  CImg<char>::CImg((CImg<char> *)&dx,0x100,1,1,1);
  pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&dx);
  *pcVar6 = '\0';
  pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&tmp._data);
  *pcVar6 = '\0';
  dy = 0;
  err = 0;
  val._4_4_ = 0;
  val._0_4_ = 0;
  local_9a[1] = 0;
  assign(this,0x100,0x100,1,1,(uchar *)(local_9a + 1));
  while (val._0_4_ = __isoc99_fscanf(local_e0,"%lf%255[^0-9eEinfa.+-]",&stack0xffffffffffffff68,
                                     delimiter._16_8_), uVar1 = dy, 0 < val._0_4_) {
    if (0 < val._0_4_) {
      iVar5 = (int)dStack_98;
      dy = dy + 1;
      puVar8 = operator()(this,uVar1,val._4_4_);
      *puVar8 = (uchar)iVar5;
    }
    if (this->_width <= dy) {
      resize(this,this->_width * 3 >> 1,this->_height,1,1,0,0,0.0,0.0,0.0,0.0);
    }
    local_9a[0] = '\0';
    pcVar6 = cimg_library::CImg::operator_cast_to_char_((CImg *)&tmp._data);
    iVar5 = __isoc99_sscanf(pcVar6,"%255[^\n]%c",tmp._16_8_,local_9a);
    if ((iVar5 == 0) || (local_9a[0] == '\n')) {
      puVar9 = std::max<unsigned_int>(&dy,(uint *)&err);
      err = *puVar9;
      val._4_4_ = val._4_4_ + 1;
      if (this->_height <= val._4_4_) {
        resize(this,this->_width,this->_height * 3 >> 1,1,1,0,0,0.0,0.0,0.0,0.0);
      }
      dy = 0;
    }
  }
  if ((dy != 0) && (val._0_4_ == 1)) {
    err = dy;
    val._4_4_ = val._4_4_ + 1;
  }
  if ((err != 0) && (val._4_4_ != 0)) {
    resize(this,err,val._4_4_,1,1,0,0,0.0,0.0,0.0,0.0);
    if (file == (FILE *)0x0) {
      cimg::fclose(local_e0);
    }
    CImg<char>::~CImg((CImg<char> *)&dx);
    CImg<char>::~CImg((CImg<char> *)&tmp._data);
    return this;
  }
  if (file == (FILE *)0x0) {
    cimg::fclose(local_e0);
  }
  this_01 = (CImgIOException *)__cxa_allocate_exception(0x10);
  uVar1 = this->_width;
  uVar2 = this->_height;
  uVar3 = this->_depth;
  uVar4 = this->_spectrum;
  puVar8 = this->_data;
  pcVar6 = "non-";
  if ((this->_is_shared & 1U) != 0) {
    pcVar6 = "";
  }
  pcVar7 = pixel_type();
  local_128 = filename;
  if (filename == (char *)0x0) {
    local_128 = "(FILE*)";
  }
  CImgIOException::CImgIOException
            (this_01,
             "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_dlm(): Invalid DLM file \'%s\'.",
             (ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar8,pcVar6,pcVar7,local_128);
  __cxa_throw(this_01,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
}

Assistant:

CImg<T>& _load_dlm(std::FILE *const file, const char *const filename) {
      if (!file && !filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_dlm(): Specified filename is (null).",
                                    cimg_instance);

      std::FILE *const nfile = file?file:cimg::fopen(filename,"r");
      CImg<charT> delimiter(256), tmp(256); *delimiter = *tmp = 0;
      unsigned int cdx = 0, dx = 0, dy = 0;
      int err = 0;
      double val;
      assign(256,256,1,1,(T)0);
      while ((err = std::fscanf(nfile,"%lf%255[^0-9eEinfa.+-]",&val,delimiter._data))>0) {
        if (err>0) (*this)(cdx++,dy) = (T)val;
        if (cdx>=_width) resize(3*_width/2,_height,1,1,0);
        char c = 0;
        if (!cimg_sscanf(delimiter,"%255[^\n]%c",tmp._data,&c) || c=='\n') {
          dx = std::max(cdx,dx);
          if (++dy>=_height) resize(_width,3*_height/2,1,1,0);
          cdx = 0;
        }
      }
      if (cdx && err==1) { dx = cdx; ++dy; }
      if (!dx || !dy) {
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimg_instance
                              "load_dlm(): Invalid DLM file '%s'.",
                              cimg_instance,
                              filename?filename:"(FILE*)");
      }
      resize(dx,dy,1,1,0);
      if (!file) cimg::fclose(nfile);
      return *this;
    }